

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  pointer pSVar1;
  SemanticException *e_2;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  tables;
  SyntacticException *e_1;
  undefined1 local_6b8 [8];
  Parser par;
  string local_690;
  undefined1 local_670 [8];
  Lexer lex;
  Tester tester;
  ArgException *e;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  allocator local_589;
  string local_588;
  undefined1 local_568 [8];
  SwitchArg argAst;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  undefined1 local_448 [8];
  SwitchArg argTest;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  undefined1 local_328 [8];
  SwitchArg argTokens;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  undefined1 local_208 [8];
  SwitchArg argInput;
  string local_158;
  allocator local_121;
  string local_120;
  undefined1 local_100 [8];
  CmdLine cmd;
  bool ast;
  bool tokens;
  bool test;
  bool input;
  char **argv_local;
  int argc_local;
  
  cmd._223_1_ = 0;
  cmd._222_1_ = 0;
  cmd._221_1_ = 0;
  cmd._220_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Toy compiler",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_158,"0.1",(allocator *)&argInput.super_Arg.field_0xa7);
  TCLAP::CmdLine::CmdLine((CmdLine *)local_100,&local_120,' ',&local_158,true);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&argInput.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"i",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"debug_input",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_278,"Print input that was given",
             (allocator *)&argTokens.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_208,&local_228,&local_250,&local_278,(CmdLineInterface *)local_100,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&argTokens.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"l",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"debug_lexer",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_398,"Print tokens",(allocator *)&argTest.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_328,&local_348,&local_370,&local_398,(CmdLineInterface *)local_100,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&argTest.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"test",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4b8,"Run tests",(allocator *)&argAst.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_448,&local_468,&local_490,&local_4b8,(CmdLineInterface *)local_100,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&argAst.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588,"a",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,"debug_ast",&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d8,"Print graphviz representation of AST",(allocator *)((long)&e + 7)
            );
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_568,&local_588,&local_5b0,&local_5d8,(CmdLineInterface *)local_100,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  TCLAP::CmdLine::parse((CmdLine *)local_100,argc,argv);
  cmd._223_1_ = TCLAP::SwitchArg::getValue((SwitchArg *)local_208);
  cmd._221_1_ = TCLAP::SwitchArg::getValue((SwitchArg *)local_328);
  cmd._222_1_ = TCLAP::SwitchArg::getValue((SwitchArg *)local_448);
  cmd._220_1_ = TCLAP::SwitchArg::getValue((SwitchArg *)local_568);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_568);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_448);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_328);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_208);
  TCLAP::CmdLine::~CmdLine((CmdLine *)local_100);
  if ((cmd._222_1_ & 1) == 0) {
    Lexer::Lexer((Lexer *)local_670);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_690,"test.ed",
               (allocator *)
               ((long)&par.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    Lexer::scan((Lexer *)local_670,&local_690,(bool)(cmd._223_1_ & 1),(bool)(cmd._221_1_ & 1));
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&par.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    Parser::Parser((Parser *)local_6b8);
    std::vector<Token,_std::allocator<Token>_>::vector
              ((vector<Token,_std::allocator<Token>_> *)&e_1,
               (vector<Token,_std::allocator<Token>_> *)
               &lex.rules.
                super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Parser::parse((Parser *)local_6b8,(vector<Token,_std::allocator<Token>_> *)&e_1);
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)&e_1);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ::vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
              *)&e_2);
    pSVar1 = std::unique_ptr<SequenceNode,_std::default_delete<SequenceNode>_>::operator->
                       ((unique_ptr<SequenceNode,_std::default_delete<SequenceNode>_> *)local_6b8);
    (*(pSVar1->super_ASTNode)._vptr_ASTNode[5])
              (pSVar1,(vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                       *)&e_2);
    if ((cmd._220_1_ & 1) != 0) {
      Parser::print((Parser *)local_6b8);
    }
    tables.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
               *)&e_2);
    Parser::~Parser((Parser *)local_6b8);
    Lexer::~Lexer((Lexer *)local_670);
  }
  else {
    this = &lex.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    Tester::Tester((Tester *)this);
    Tester::
    specify<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
              ((Tester *)this,"assign.ed","decl.ed","funcargsret.ed","funcargsvoid.ed",
               "funcvoidvoid.ed","if.ed","ifelse.ed","nestedif.ed","functions.ed","struct.ed",
               "inferdecl.ed");
    Tester::runAll((Tester *)
                   &lex.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    Tester::~Tester((Tester *)
                    &lex.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    bool input = false;
    bool test = false;
    bool tokens = false;
    bool ast = false;
    try {
        TCLAP::CmdLine cmd("Toy compiler", ' ', "0.1");

        TCLAP::SwitchArg argInput("i","debug_input","Print input that was given", cmd, false);
        TCLAP::SwitchArg argTokens("l","debug_lexer","Print tokens", cmd, false);
        TCLAP::SwitchArg argTest("","test","Run tests", cmd, false);
        TCLAP::SwitchArg argAst("a","debug_ast","Print graphviz representation of AST", cmd, false);

        // Parse the argv array.
        cmd.parse(argc, argv);

        // Get the value parsed by each arg.
        input = argInput.getValue();
        tokens = argTokens.getValue();
        test = argTest.getValue();
        ast = argAst.getValue();
    } catch (TCLAP::ArgException &e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
    }

    // run all tests then quit
    if (test) {
        Tester tester;
        tester.specify("assign.ed",
                       "decl.ed",
                       "funcargsret.ed", "funcargsvoid.ed",
                       "funcvoidvoid.ed", "if.ed",
                       "ifelse.ed", "nestedif.ed",
                       "functions.ed", "struct.ed", "inferdecl.ed"
                       );
        tester.runAll();
        return 0;
    }

    Lexer lex;
    lex.scan("test.ed", input, tokens);

    // syntactic validation
    Parser par;
    try {
        par.parse(lex.tokens);
    }
    catch (const SyntacticException& e) {
        std::cout << e.what();
        return -1;
    }

    // semantic validation
    std::vector<SymbolTable> tables;
    try {
        par.root->check(tables);
    }
    catch (const SemanticException& e) {
        std::cout << e.what();
        return -2;
    }

    if (ast) {
        par.print();
    }
    // std::cout << "table size: " << tables.size() << std::endl;
    // for (auto t : tables) {
    //     for (auto i : t) {
    //         std::cout << "name: " << i.first << std::endl
    //                   << "\tkind: " << i.second.kind << std::endl
    //                   << "\ttype: " << i.second.type << std::endl
    //                   << "\tscope: " << i.second.scope << std::endl;
    //     }
    // }
}